

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter_buffer.c
# Opt level: O0

void aom_wb_write_signed_primitive_refsubexpfin
               (aom_write_bit_buffer *wb,uint16_t n,uint16_t k,int16_t ref,int16_t v)

{
  undefined8 in_RDI;
  uint16_t scaled_n;
  aom_write_bit_buffer *unaff_retaddr;
  
  wb_write_primitive_refsubexpfin
            (unaff_retaddr,(uint16_t)((ulong)in_RDI >> 0x30),(uint16_t)((ulong)in_RDI >> 0x20),
             (uint16_t)((ulong)in_RDI >> 0x10),(uint16_t)in_RDI);
  return;
}

Assistant:

void aom_wb_write_signed_primitive_refsubexpfin(struct aom_write_bit_buffer *wb,
                                                uint16_t n, uint16_t k,
                                                int16_t ref, int16_t v) {
  ref += n - 1;
  v += n - 1;
  const uint16_t scaled_n = (n << 1) - 1;
  wb_write_primitive_refsubexpfin(wb, scaled_n, k, ref, v);
}